

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_flbi.c
# Opt level: O1

char * cmime_flbi_get_boundary(char *s)

{
  char cVar1;
  char *pcVar2;
  size_t sVar3;
  ulong uVar4;
  char *pcVar5;
  
  pcVar2 = strcasestr(s,"boundary=");
  if (pcVar2 == (char *)0x0) {
    pcVar2 = (char *)0x0;
  }
  else {
    pcVar2 = strchr(pcVar2,0x3d);
    pcVar5 = pcVar2 + 1;
    if (pcVar2[1] == '\"') {
      pcVar5 = pcVar2 + 2;
    }
    sVar3 = strlen(pcVar5);
    pcVar2 = (char *)calloc(sVar3 + 1,1);
    for (uVar4 = 0; cVar1 = pcVar5[uVar4], cVar1 != '\0'; uVar4 = uVar4 + 1) {
      if ((cVar1 == '\"') || (cVar1 == ';')) {
        pcVar2[uVar4 & 0xffffffff] = '\0';
        break;
      }
      pcVar2[uVar4] = cVar1;
    }
  }
  if (pcVar2 == (char *)0x0) {
    pcVar5 = (char *)0x0;
  }
  else {
    pcVar5 = cmime_string_strip(pcVar2);
    if (pcVar5 != pcVar2) {
      pcVar5 = strdup(pcVar5);
      free(pcVar2);
    }
  }
  return pcVar5;
}

Assistant:

char *cmime_flbi_get_boundary(char *s) {
    char *t = NULL;
    char *boundary = NULL;  
    char *p = NULL;
    int pos = 0;

    p = strcasestr(s,"boundary=");
    if (p != NULL) {
        s = strstr(p,"=");
        if (*++s=='"') 
            s++;
                
        t = (char *)calloc(strlen(s) + sizeof(char),sizeof(char));
        while(*s!='\0') {
            if ((*s!=';') && (*s!='"'))
                t[pos++] = *s;
            else {
                t[pos] = '\0';
                break;
            }
            s++;
        }
    }

    if (t != NULL) {
        char *stripped = cmime_string_strip(t);
        if (stripped != t) {
            boundary = strdup(stripped);
            free(t);
        } else
            boundary = stripped;
    } else
        boundary = t;

    return boundary;
}